

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::image_type_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t id,bool param_3
          )

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  CompilerError *pCVar4;
  char *pcVar5;
  char *local_368;
  allocator local_311;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  allocator local_299;
  string local_298;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  undefined1 local_228 [8];
  SPIRType sampled_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  undefined1 local_50 [8];
  string res;
  SPIRType *imagetype;
  bool param_3_local;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->image);
  res.field_2._8_8_ = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
  ::std::__cxx11::string::string((string *)local_50);
  switch(*(undefined4 *)(res.field_2._8_8_ + 0x10)) {
  case 3:
  case 5:
  case 7:
    ::std::__cxx11::string::operator=((string *)local_50,"i");
    break;
  case 4:
  case 6:
  case 8:
    ::std::__cxx11::string::operator=((string *)local_50,"u");
    break;
  case 9:
    ::std::__cxx11::string::operator=((string *)local_50,"i64");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_80,"GL_EXT_shader_image_int64",&local_81);
    require_extension_internal(this,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
    break;
  case 10:
    ::std::__cxx11::string::operator=((string *)local_50,"u64");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_a8,"GL_EXT_shader_image_int64",&local_a9);
    require_extension_internal(this,&local_a8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  if (((type->basetype == Image) && ((type->image).dim == DimSubpassData)) &&
     (((this->options).vulkan_semantics & 1U) != 0)) {
    ::std::operator+(&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "subpassInput");
    pcVar5 = "";
    if (((type->image).ms & 1U) != 0) {
      pcVar5 = "MS";
    }
    ::std::operator+(__return_storage_ptr__,&local_d0,pcVar5);
    ::std::__cxx11::string::~string((string *)&local_d0);
    sampled_type.member_name_cache._M_h._M_single_bucket._4_4_ = 1;
  }
  else if (((type->basetype == Image) && ((type->image).dim == DimSubpassData)) &&
          (bVar1 = subpass_input_is_framebuffer_fetch(this,id), bVar1)) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->image);
    pSVar3 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
    SPIRType::SPIRType((SPIRType *)local_228,pSVar3);
    sampled_type.basetype = UByte;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,local_228,0);
    sampled_type.member_name_cache._M_h._M_single_bucket._4_4_ = 1;
    SPIRType::~SPIRType((SPIRType *)local_228);
  }
  else {
    if ((type->basetype == Image) && ((type->image).dim != DimSubpassData)) {
      if (((type->image).dim == Buffer) && ((type->image).sampled == 1)) {
        ::std::__cxx11::string::operator+=((string *)local_50,"sampler");
      }
      else {
        pcVar5 = "texture";
        if ((type->image).sampled == 2) {
          pcVar5 = "image";
        }
        ::std::__cxx11::string::operator+=((string *)local_50,pcVar5);
      }
    }
    else {
      ::std::__cxx11::string::operator+=((string *)local_50,"sampler");
    }
    switch((type->image).dim) {
    case Dim1D:
      if (((this->options).es & 1U) == 0) {
        local_368 = "1D";
      }
      else {
        local_368 = "2D";
      }
      ::std::__cxx11::string::operator+=((string *)local_50,local_368);
      break;
    case Dim2D:
      ::std::__cxx11::string::operator+=((string *)local_50,"2D");
      break;
    case Dim3D:
      ::std::__cxx11::string::operator+=((string *)local_50,"3D");
      break;
    case Cube:
      ::std::__cxx11::string::operator+=((string *)local_50,"Cube");
      break;
    case DimRect:
      if (((this->options).es & 1U) != 0) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Rectangle textures are not supported on OpenGL ES.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      bVar1 = is_legacy_desktop(this);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_248,"GL_ARB_texture_rectangle",&local_249);
        require_extension_internal(this,&local_248);
        ::std::__cxx11::string::~string((string *)&local_248);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_249);
      }
      ::std::__cxx11::string::operator+=((string *)local_50,"2DRect");
      break;
    case Buffer:
      if ((((this->options).es & 1U) == 0) || (0x13f < (this->options).version)) {
        if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x8c)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_298,"GL_EXT_texture_buffer_object",&local_299);
          require_extension_internal(this,&local_298);
          ::std::__cxx11::string::~string((string *)&local_298);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_299);
        }
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_270,"GL_EXT_texture_buffer",&local_271);
        require_extension_internal(this,&local_270);
        ::std::__cxx11::string::~string((string *)&local_270);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_271);
      }
      ::std::__cxx11::string::operator+=((string *)local_50,"Buffer");
      break;
    case DimSubpassData:
      ::std::__cxx11::string::operator+=((string *)local_50,"2D");
      break;
    default:
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"Only 1D, 2D, 2DRect, 3D, Buffer, InputTarget and Cube textures supported.")
      ;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((type->image).ms & 1U) != 0) {
      ::std::__cxx11::string::operator+=((string *)local_50,"MS");
    }
    if (((type->image).arrayed & 1U) != 0) {
      bVar1 = is_legacy_desktop(this);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_2c0,"GL_EXT_texture_array",&local_2c1);
        require_extension_internal(this,&local_2c0);
        ::std::__cxx11::string::~string((string *)&local_2c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      }
      ::std::__cxx11::string::operator+=((string *)local_50,"Array");
    }
    if ((((type->basetype == SampledImage) || (type->basetype == Sampler)) &&
        (bVar1 = Compiler::is_depth_image(&this->super_Compiler,type,id), bVar1)) &&
       ((::std::__cxx11::string::operator+=((string *)local_50,"Shadow"), (type->image).dim == Cube
        && (bVar1 = is_legacy(this), bVar1)))) {
      if (((this->options).es & 1U) == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_2e8,"GL_EXT_gpu_shader4",&local_2e9);
        require_extension_internal(this,&local_2e8);
        ::std::__cxx11::string::~string((string *)&local_2e8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_310,"GL_NV_shadow_samplers_cube",&local_311)
        ;
        require_extension_internal(this,&local_310);
        ::std::__cxx11::string::~string((string *)&local_310);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_311);
        ::std::__cxx11::string::operator+=((string *)local_50,"NV");
      }
    }
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_50);
    sampled_type.member_name_cache._M_h._M_single_bucket._4_4_ = 1;
  }
  ::std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::image_type_glsl(const SPIRType &type, uint32_t id, bool /*member*/)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	string res;

	switch (imagetype.basetype)
	{
	case SPIRType::Int64:
		res = "i64";
		require_extension_internal("GL_EXT_shader_image_int64");
		break;
	case SPIRType::UInt64:
		res = "u64";
		require_extension_internal("GL_EXT_shader_image_int64");
		break;
	case SPIRType::Int:
	case SPIRType::Short:
	case SPIRType::SByte:
		res = "i";
		break;
	case SPIRType::UInt:
	case SPIRType::UShort:
	case SPIRType::UByte:
		res = "u";
		break;
	default:
		break;
	}

	// For half image types, we will force mediump for the sampler, and cast to f16 after any sampling operation.
	// We cannot express a true half texture type in GLSL. Neither for short integer formats for that matter.

	if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData && options.vulkan_semantics)
		return res + "subpassInput" + (type.image.ms ? "MS" : "");
	else if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
	         subpass_input_is_framebuffer_fetch(id))
	{
		SPIRType sampled_type = get<SPIRType>(type.image.type);
		sampled_type.vecsize = 4;
		return type_to_glsl(sampled_type);
	}

	// If we're emulating subpassInput with samplers, force sampler2D
	// so we don't have to specify format.
	if (type.basetype == SPIRType::Image && type.image.dim != DimSubpassData)
	{
		// Sampler buffers are always declared as samplerBuffer even though they might be separate images in the SPIR-V.
		if (type.image.dim == DimBuffer && type.image.sampled == 1)
			res += "sampler";
		else
			res += type.image.sampled == 2 ? "image" : "texture";
	}
	else
		res += "sampler";

	switch (type.image.dim)
	{
	case Dim1D:
		// ES doesn't support 1D. Fake it with 2D.
		res += options.es ? "2D" : "1D";
		break;
	case Dim2D:
		res += "2D";
		break;
	case Dim3D:
		res += "3D";
		break;
	case DimCube:
		res += "Cube";
		break;
	case DimRect:
		if (options.es)
			SPIRV_CROSS_THROW("Rectangle textures are not supported on OpenGL ES.");

		if (is_legacy_desktop())
			require_extension_internal("GL_ARB_texture_rectangle");

		res += "2DRect";
		break;

	case DimBuffer:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_texture_buffer");
		else if (!options.es && options.version < 140)
			require_extension_internal("GL_EXT_texture_buffer_object");
		res += "Buffer";
		break;

	case DimSubpassData:
		res += "2D";
		break;
	default:
		SPIRV_CROSS_THROW("Only 1D, 2D, 2DRect, 3D, Buffer, InputTarget and Cube textures supported.");
	}

	if (type.image.ms)
		res += "MS";
	if (type.image.arrayed)
	{
		if (is_legacy_desktop())
			require_extension_internal("GL_EXT_texture_array");
		res += "Array";
	}

	// "Shadow" state in GLSL only exists for samplers and combined image samplers.
	if (((type.basetype == SPIRType::SampledImage) || (type.basetype == SPIRType::Sampler)) &&
	    is_depth_image(type, id))
	{
		res += "Shadow";

		if (type.image.dim == DimCube && is_legacy())
		{
			if (!options.es)
				require_extension_internal("GL_EXT_gpu_shader4");
			else
			{
				require_extension_internal("GL_NV_shadow_samplers_cube");
				res += "NV";
			}
		}
	}

	return res;
}